

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<int,_false,_true>::BaseTypedDirectSetItemNoSet
          (TypedArray<int,_false,_true> *this,uint32 index,Var value,
          _func_int_Var_ScriptContext_ptr *convFunc)

{
  bool bVar1;
  ScriptContext *pSVar2;
  _func_int_Var_ScriptContext_ptr *convFunc_local;
  Var value_local;
  uint32 index_local;
  TypedArray<int,_false,_true> *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  (*convFunc)(value,pSVar2);
  bVar1 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (!bVar1) {
    return 0;
  }
  pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL BaseTypedDirectSetItemNoSet(__in uint32 index, __in Js::Var value, TypeName (*convFunc)(Var value, ScriptContext* scriptContext))
        {
            // This call can potentially invoke user code, and may end up detaching the underlying array (this).
            // Therefore it was brought out and above the IsDetached check
            convFunc(value, GetScriptContext());

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            return FALSE;
        }